

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExport.cpp
# Opt level: O3

bool __thiscall
ODDLParser::OpenDDLExport::writeValue(OpenDDLExport *this,Value *val,string *statement)

{
  byte bVar1;
  int8 iVar2;
  int16 iVar3;
  uint16 uVar4;
  uint32 uVar5;
  uint uVar6;
  char *__s;
  size_t sVar7;
  int64 iVar8;
  uint64 uVar9;
  float fVar10;
  double dVar11;
  char buffer [256];
  stringstream stream;
  long *local_2a8 [2];
  long local_298 [30];
  stringstream local_1a8 [16];
  long local_198 [14];
  ios_base local_128 [264];
  
  if (val == (Value *)0x0) goto switchD_006cf32f_caseD_9;
  switch(val->m_type) {
  case ddl_bool:
    Value::getBool(val);
    std::__cxx11::string::append((char *)statement);
    goto switchD_006cf32f_caseD_9;
  case ddl_int8:
    std::__cxx11::stringstream::stringstream(local_1a8);
    iVar2 = Value::getInt8(val);
    std::ostream::operator<<(local_198,(int)iVar2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)statement,(ulong)local_2a8[0]);
    break;
  case ddl_int16:
    std::__cxx11::stringstream::stringstream(local_1a8);
    memset(local_2a8,0,0x100);
    iVar3 = Value::getInt16(val);
    sprintf((char *)local_2a8,"%d",(ulong)(uint)(int)iVar3);
    std::__cxx11::string::append((char *)statement);
    goto LAB_006cf68c;
  case ddl_int32:
    std::__cxx11::stringstream::stringstream(local_1a8);
    memset(local_2a8,0,0x100);
    uVar6 = Value::getInt32(val);
    sprintf((char *)local_2a8,"%d",(ulong)uVar6);
    std::__cxx11::string::append((char *)statement);
    goto LAB_006cf68c;
  case ddl_int64:
    std::__cxx11::stringstream::stringstream(local_1a8);
    iVar8 = Value::getInt64(val);
    std::ostream::operator<<(local_198,(int)iVar8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)statement,(ulong)local_2a8[0]);
    break;
  case ddl_unsigned_int8:
    std::__cxx11::stringstream::stringstream(local_1a8);
    bVar1 = Value::getUnsignedInt8(val);
    std::ostream::operator<<(local_198,(uint)bVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)statement,(ulong)local_2a8[0]);
    break;
  case ddl_unsigned_int16:
    std::__cxx11::stringstream::stringstream(local_1a8);
    uVar4 = Value::getUnsignedInt16(val);
    std::ostream::operator<<(local_198,(uint)uVar4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)statement,(ulong)local_2a8[0]);
    break;
  case ddl_unsigned_int32:
    std::__cxx11::stringstream::stringstream(local_1a8);
    uVar5 = Value::getUnsignedInt32(val);
    std::ostream::operator<<(local_198,uVar5);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)statement,(ulong)local_2a8[0]);
    break;
  case ddl_unsigned_int64:
    std::__cxx11::stringstream::stringstream(local_1a8);
    uVar9 = Value::getUnsignedInt64(val);
    std::ostream::operator<<(local_198,(int)uVar9);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)statement,(ulong)local_2a8[0]);
    break;
  default:
    goto switchD_006cf32f_caseD_9;
  case ddl_float:
    std::__cxx11::stringstream::stringstream(local_1a8);
    fVar10 = Value::getFloat(val);
    std::ostream::_M_insert<double>((double)fVar10);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)statement,(ulong)local_2a8[0]);
    break;
  case ddl_double:
    std::__cxx11::stringstream::stringstream(local_1a8);
    dVar11 = Value::getDouble(val);
    std::ostream::_M_insert<double>(dVar11);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)statement,(ulong)local_2a8[0]);
    break;
  case ddl_string:
    std::__cxx11::stringstream::stringstream(local_1a8);
    __s = Value::getString(val);
    if (__s == (char *)0x0) {
      std::ios::clear((int)(ostream *)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
    }
    else {
      sVar7 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar7);
    }
    std::__cxx11::string::append((char *)statement);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)statement,(ulong)local_2a8[0]);
    if (local_2a8[0] != local_298) {
      operator_delete(local_2a8[0],local_298[0] + 1);
    }
    std::__cxx11::string::append((char *)statement);
    goto LAB_006cf68c;
  }
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0],local_298[0] + 1);
  }
LAB_006cf68c:
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
switchD_006cf32f_caseD_9:
  return val != (Value *)0x0;
}

Assistant:

bool OpenDDLExport::writeValue( Value *val, std::string &statement ) {
    if (ddl_nullptr == val) {
        return false;
    }

    switch ( val->m_type ) {
        case Value::ddl_bool:
            if ( true == val->getBool() ) {
                statement += "true";
            } else {
                statement += "false";
            }
            break;
        case Value::ddl_int8: 
            {
                std::stringstream stream;
                const int i = static_cast<int>( val->getInt8() );
                stream << i;
                statement += stream.str();
            }
            break;
        case Value::ddl_int16:
            {
                std::stringstream stream;
                char buffer[ 256 ];
                ::memset( buffer, '\0', 256 * sizeof( char ) );
                sprintf( buffer, "%d", val->getInt16() );
                statement += buffer;
        }
            break;
        case Value::ddl_int32:
            {
                std::stringstream stream;
                char buffer[ 256 ];
                ::memset( buffer, '\0', 256 * sizeof( char ) );
                const int i = static_cast< int >( val->getInt32() );
                sprintf( buffer, "%d", i );
                statement += buffer;
            }
            break;
        case Value::ddl_int64:
            {
                std::stringstream stream;
                const int i = static_cast< int >( val->getInt64() );
                stream << i;
                statement += stream.str();
            }
            break;
        case Value::ddl_unsigned_int8:
            {
                std::stringstream stream;
                const int i = static_cast< unsigned int >( val->getUnsignedInt8() );
                stream << i;
                statement += stream.str();
            }
            break;
        case Value::ddl_unsigned_int16:
            {
                std::stringstream stream;
                const int i = static_cast< unsigned int >( val->getUnsignedInt16() );
                stream << i;
                statement += stream.str();
            }
            break;
        case Value::ddl_unsigned_int32:
            {
                std::stringstream stream;
                const int i = static_cast< unsigned int >( val->getUnsignedInt32() );
                stream << i;
                statement += stream.str();
            }
            break;
        case Value::ddl_unsigned_int64:
            {
                std::stringstream stream;
                const int i = static_cast< unsigned int >( val->getUnsignedInt64() );
                stream << i;
                statement += stream.str();
            }
            break;
        case Value::ddl_half:
            break;
        case Value::ddl_float:
            {
                std::stringstream stream;
                stream << val->getFloat();
                statement += stream.str();
            }
            break;
        case Value::ddl_double:
            {
                std::stringstream stream;
                stream << val->getDouble();
                statement += stream.str();
            }
            break;
        case Value::ddl_string:
            {
                std::stringstream stream;
                stream << val->getString();
                statement += "\"";
                statement += stream.str();
                statement += "\"";
             }
            break;
        case Value::ddl_ref:
            break;
        case Value::ddl_none:
        case Value::ddl_types_max:
        default:
            break;
    }

    return true;
}